

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O0

void __thiscall TestEncoding::testEncoding<int>(TestEncoding *this,int start,int stop)

{
  ostream *poVar1;
  int in_EDX;
  int in_ESI;
  int i;
  int diff;
  int val;
  int32_t in_stack_0000008c;
  TestEncoding *in_stack_00000090;
  int local_1c;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"testing from ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ESI);
  poVar1 = std::operator<<(poVar1," to ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_EDX);
  std::operator<<(poVar1," inclusive\n");
  for (local_1c = 0; local_1c < (in_EDX - in_ESI) + 1; local_1c = local_1c + 1) {
    compare(in_stack_00000090,in_stack_0000008c);
  }
  return;
}

Assistant:

void testEncoding(IntType start, IntType stop)
    {
        std::cout << "testing from " << start << " to " << stop << " inclusive\n";
        IntType val = start;
        IntType diff = stop - start + 1;

        for(IntType i = 0; i < diff; ++i) {
            compare(val+i);
        }
    }